

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::CountPropagateStats
          (duckdb *this,ClientContext *context,BoundAggregateExpression *expr,
          AggregateStatisticsInput *input)

{
  bool bVar1;
  reference this_00;
  AggregateFunction AStack_148;
  
  if (expr->aggr_type != DISTINCT) {
    this_00 = vector<duckdb::BaseStatistics,_true>::get<true>(input->child_stats,0);
    bVar1 = BaseStatistics::CanHaveNull(this_00);
    if (!bVar1) {
      CountStarFun::GetFunction();
      AggregateFunction::operator=(&expr->function,&AStack_148);
      AggregateFunction::~AggregateFunction(&AStack_148);
      ::std::__cxx11::string::assign
                ((char *)&(expr->function).super_BaseScalarFunction.super_SimpleFunction.
                          super_Function.name);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::clear(&(expr->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             );
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> CountPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                               AggregateStatisticsInput &input) {
	if (!expr.IsDistinct() && !input.child_stats[0].CanHaveNull()) {
		// count on a column without null values: use count star
		expr.function = CountStarFun::GetFunction();
		expr.function.name = "count_star";
		expr.children.clear();
	}
	return nullptr;
}